

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::AssertionInfo::AssertionInfo
          (AssertionInfo *this,string *_macroName,SourceLineInfo *_lineInfo,
          string *_capturedExpression,Flags _resultDisposition)

{
  std::__cxx11::string::string((string *)this,(string *)_macroName);
  SourceLineInfo::SourceLineInfo(&this->lineInfo,_lineInfo);
  std::__cxx11::string::string((string *)&this->capturedExpression,(string *)_capturedExpression);
  this->resultDisposition = _resultDisposition;
  return;
}

Assistant:

AssertionInfo::AssertionInfo(   std::string const& _macroName,
                                    SourceLineInfo const& _lineInfo,
                                    std::string const& _capturedExpression,
                                    ResultDisposition::Flags _resultDisposition )
    :   macroName( _macroName ),
        lineInfo( _lineInfo ),
        capturedExpression( _capturedExpression ),
        resultDisposition( _resultDisposition )
    {}